

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinput.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *pvVar2;
  char *local_118;
  undefined4 local_110;
  undefined4 local_108;
  Am_Style *local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  my_input_handlers *local_b0;
  Am_Style *local_a0;
  undefined8 *local_98;
  undefined1 *local_90;
  Am_Drawonable *local_88;
  Am_Input_Char *local_80;
  my_input_handlers *local_78;
  Am_Style *local_70;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  Am_Drawonable *local_50;
  Am_Style local_48 [24];
  Am_Style local_30 [8];
  undefined8 *local_28;
  Am_Drawonable *root;
  my_input_handlers local_18;
  my_input_handlers handlers;
  
  handlers.super_Am_Input_Event_Handlers._vptr_Am_Input_Event_Handlers._4_4_ = 0;
  local_78 = &local_18;
  my_input_handlers::my_input_handlers(local_78);
  local_80 = (Am_Input_Char *)((long)&root + 4);
  Am_Input_Char::Am_Input_Char(local_80,"Q",true);
  Am_Input_Char::operator=(&test_ic,local_80);
  local_5c = 0;
  local_28 = (undefined8 *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Size of Am_Input_Char is ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  _Am_Debug_Print_Input_Events = 1;
  local_68 = local_28;
  local_70 = local_30;
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  local_b0 = local_78;
  local_100 = local_70;
  local_118 = "testinput icon";
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 1;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 1;
  local_f0 = 1;
  local_f8 = 0;
  local_108 = 0;
  local_110 = 1;
  local_58 = (undefined1 *)&local_118;
  d = (Am_Drawonable *)(**(code **)*local_68)(local_68,800,local_5c,500,200,"testinput");
  local_50 = d;
  Am_Style::~Am_Style(local_30);
  local_98 = local_28;
  local_a0 = local_48;
  Am_Style::Am_Style(local_a0,(Am_Style *)&Am_No_Style);
  local_b0 = &local_18;
  local_100 = local_a0;
  local_118 = "testinput2 icon";
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 1;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 1;
  local_f0 = 1;
  local_f8 = 0;
  local_108 = 0;
  local_110 = 1;
  local_90 = (undefined1 *)&local_118;
  d2 = (Am_Drawonable *)(**(code **)*local_98)(local_98,800,300,500,200,"testinput2");
  local_88 = d2;
  Am_Style::~Am_Style(local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"window 1 = ");
  pvVar2 = (void *)operator<<(poVar1,d);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"window 2 = ");
  pvVar2 = (void *)operator<<(poVar1,d2);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  (**(code **)(*(long *)d + 0xa0))();
  (**(code **)(*(long *)d2 + 0xa0))();
  std::operator<<((ostream *)&std::cout,"******  Now type keys into window.\n");
  std::operator<<((ostream *)&std::cout,"^M want mouse move, ^m don\'t want mouse move.\n");
  std::operator<<((ostream *)&std::cout,"^E want enter leave, ^e don\'t want enter leave.\n");
  std::operator<<((ostream *)&std::cout,
                  "^W want multiple windows, ^w don\'t want multiple windows.\n");
  std::operator<<((ostream *)&std::cout,"^t to change test input string.\n");
  Am_Drawonable::Main_Loop();
  return 0;
}

Assistant:

int
main()
{

  my_input_handlers handlers;

  test_ic = Am_Input_Char("Q");

  Am_Drawonable *root = Am_Drawonable::Get_Root_Drawonable();

  cout << "Size of Am_Input_Char is " << sizeof(test_ic) << endl;

  Am_Debug_Print_Input_Events = 1;

  d = root->Create(TESTINPUT_D_LEFT, TESTINPUT_D_TOP, 500, 200, "testinput",
                   "testinput icon", true, false, Am_No_Style, false, 1, 1, 0,
                   0, true, false, false, false, &handlers);

  d2 = root->Create(TESTINPUT_D2_LEFT, TESTINPUT_D2_TOP, 500, 200, "testinput2",
                    "testinput2 icon", true, false, Am_No_Style, false, 1, 1, 0,
                    0, true, false, false, false, &handlers);

  cout << "window 1 = " << d << endl;
  cout << "window 2 = " << d2 << endl;

  d->Flush_Output();
  d2->Flush_Output();

  cout << "******  Now type keys into window.\n";
  cout << "^M want mouse move, ^m don't want mouse move.\n";
  cout << "^E want enter leave, ^e don't want enter leave.\n";
  cout << "^W want multiple windows, ^w don't want multiple windows.\n";
  cout << "^t to change test input string.\n";

  Am_Drawonable::Main_Loop();

  return 0;
}